

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVectorBase<char>::resizeRealloc<slang::SmallVectorBase<char>::DefaultInitTag>
          (SmallVectorBase<char> *this,size_type newSize,DefaultInitTag *val)

{
  ulong uVar1;
  pointer __src;
  pointer __dest;
  ulong n;
  
  if (-1 < (long)newSize) {
    uVar1 = this->cap;
    n = uVar1 * 2;
    if (uVar1 * 2 <= newSize) {
      n = newSize;
    }
    if (0x7fffffffffffffff - uVar1 < uVar1) {
      n = 0x7fffffffffffffff;
    }
    __dest = (pointer)operator_new(n);
    __src = this->data_;
    if (this->len != 0) {
      memmove(__dest,__src,this->len);
    }
    if (__src != this->firstElement) {
      operator_delete(__src);
    }
    this->len = newSize;
    this->cap = n;
    this->data_ = __dest;
    return;
  }
  detail::throwLengthError();
}

Assistant:

void SmallVectorBase<T>::resizeRealloc(size_type newSize, const TVal& val) {
    SLANG_ASSERT(newSize > len);
    if (newSize > max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(newSize);
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    std::uninitialized_move(begin(), end(), newData);

    if constexpr (std::is_same_v<T, TVal>) {
        std::ranges::uninitialized_fill_n(newData + len, ptrdiff_t(newSize - len), val);
    }
    else if constexpr (std::is_same_v<TVal, DefaultInitTag>) {
        std::ranges::uninitialized_default_construct_n(newData + len, ptrdiff_t(newSize - len));
    }
    else {
        std::ranges::uninitialized_value_construct_n(newData + len, ptrdiff_t(newSize - len));
    }

    cleanup();
    len = newSize;
    cap = newCap;
    data_ = newData;
}